

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_cubic_interpolation.cpp
# Opt level: O3

int main(void)

{
  vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *pvVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *pvVar7;
  PointType p;
  double t;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> vec;
  Mat img;
  CubicInterpolation cubic;
  undefined1 local_178 [44];
  undefined4 uStack_14c;
  vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *local_148;
  double local_140;
  double local_138;
  _InputArray local_130;
  void *local_118;
  long lStack_110;
  long local_108;
  double local_f8;
  undefined8 local_f0;
  PointType local_e8 [6];
  CubicInterpolation local_88;
  
  local_88.super_Curve<3,_2>.length_ = -1.0;
  local_88.super_Curve<3,_2>._vptr_Curve = (_func_int **)&PTR_computeLength_001079f0;
  local_88.coeffs_[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = 0.0;
  local_88.coeffs_[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[1] = 0.0;
  local_88.coeffs_[1].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = 0.0;
  local_88.coeffs_[1].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[1] = 0.0;
  local_88.coeffs_[2].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = 0.0;
  local_88.coeffs_[2].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[1] = 0.0;
  local_88.coeffs_[3].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = 0.0;
  local_88.coeffs_[3].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[1] = 0.0;
  local_e8[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
       = 100.0;
  local_e8[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
       = 100.0;
  local_178._0_8_ = (_func_int **)0x4072c00000000000;
  local_178._8_8_ = 300.0;
  CubicInterpolation::interpolation(&local_88,local_e8,0.0,(PointType *)local_178,0.0);
  local_178._16_8_ = 0.0;
  local_178._24_8_ = 0.0;
  local_178._0_8_ = (_func_int **)0x0;
  local_178._8_8_ = 0.0;
  cv::Mat::Mat((Mat *)local_e8,400,400,0x10,(Scalar_ *)local_178);
  local_130.obj = &local_118;
  local_108 = 0;
  local_118 = (void *)0x0;
  lStack_110 = 0;
  local_138 = 0.0;
  do {
    local_178._40_4_ = 0;
    CubicInterpolation::at((CubicInterpolation *)local_178,(double *)&local_88,(int *)&local_138);
    local_178._40_4_ = (undefined4)(double)local_178._0_8_;
    local_130.flags = (int)(double)local_178._8_8_;
    std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<int,int>
              ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)local_130.obj,
               (int *)(local_178 + 0x28),&local_130.flags);
    local_138 = local_138 + 0.01;
  } while (local_138 <= 1.0);
  local_140 = 0.0;
  local_178._40_4_ = 0x3010000;
  local_130.sz.width = 0;
  local_130.sz.height = 0;
  local_130.flags = -0x7efcfff4;
  local_178._0_8_ = (_func_int **)0x0;
  local_178._8_8_ = 0.0;
  local_178._16_8_ = 255.0;
  local_178._24_8_ = 0.0;
  local_148 = (vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)local_e8;
  cv::polylines((_InputOutputArray *)(local_178 + 0x28),&local_130,false,(Scalar_ *)local_178,1,0x10
                ,0);
  uVar3 = lStack_110 - (long)local_118 >> 3;
  local_f8 = 0.0;
  if (1 < uVar3) {
    uVar4 = 1;
    do {
      iVar5 = *(int *)((long)local_118 + uVar4 * 8) - *(int *)((long)local_118 + uVar4 * 8 + -8);
      iVar6 = *(int *)((long)local_118 + uVar4 * 8 + 4) - *(int *)((long)local_118 + uVar4 * 8 + -4)
      ;
      local_f8 = local_f8 + SQRT((double)(iVar6 * iVar6 + iVar5 * iVar5));
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"naive length: ",0xe);
  poVar2 = std::ostream::_M_insert<double>(local_f8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"length: ",8);
  poVar2 = std::ostream::_M_insert<double>(local_88.super_Curve<3,_2>.length_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_178._0_8_ = (_func_int **)0x4034000000000000;
  local_130.flags = 4;
  Curve<3,_2>::sampleWithArcLengthParameterized
            ((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)(local_178 + 0x28),&local_88.super_Curve<3,_2>,(double *)local_178,true,
             &local_130.flags,(vector<double,_std::allocator<double>_> *)0x0);
  pvVar1 = local_148;
  pvVar7 = (vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)
           CONCAT44(uStack_14c,local_178._40_4_);
  if (pvVar7 != local_148) {
    do {
      local_130.sz.width = 0;
      local_130.sz.height = 0;
      local_130.flags = 0x3010000;
      local_f0 = CONCAT44((int)*(double *)(pvVar7 + 8),(int)*(double *)pvVar7);
      local_178._0_8_ = (_func_int **)0x406fe00000000000;
      local_178._8_8_ = 255.0;
      local_178._16_8_ = 255.0;
      local_178._24_8_ = 0.0;
      local_130.obj = (vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)local_e8;
      cv::circle(&local_130,&local_f0,4,local_178,1,8,0);
      pvVar7 = pvVar7 + 0x10;
    } while (pvVar7 != pvVar1);
    pvVar7 = (vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)
             CONCAT44(uStack_14c,local_178._40_4_);
  }
  if (pvVar7 != (vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)0x0) {
    operator_delete(pvVar7,(long)local_140 - (long)pvVar7);
  }
  local_178._0_8_ = local_178 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"Cubic Interpolation","");
  local_140 = 0.0;
  local_178._40_4_ = 0x1010000;
  local_148 = (vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)local_e8;
  cv::imshow((string *)local_178,(_InputArray *)(local_178 + 0x28));
  if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  cv::waitKey(0);
  if (local_118 != (void *)0x0) {
    operator_delete(local_118,local_108 - (long)local_118);
  }
  cv::Mat::~Mat((Mat *)local_e8);
  return 0;
}

Assistant:

int main() {
  // fit a cubic spline
  CubicInterpolation cubic;
  cubic.interpolation({100, 100}, 0, {300, 300}, 0);

  int width = 400;
  Mat img(width, width, CV_8UC3, Scalar(0));

  vector<Point> vec;
  double t = 0.0, step = 0.01;
  while (t <= 1.0) {
    auto p = cubic.at(t);
    vec.emplace_back(int(p[0]), int(p[1]));
    t += step;
  }
  polylines(img, vec, false, {0, 0, 255}, 1, LINE_AA);
  double acc_length = 0;
  for (int i = 1; i < vec.size(); ++i) {
    auto p = (vec[i] - vec[i - 1]);
    acc_length += sqrt(p.x * p.x + p.y * p.y);
  }
  cout << "naive length: " << acc_length << endl;
  cout << "length: " << cubic.length() << endl;

  // Uniform sampling
  for (auto p : cubic.sampleWithArcLengthParameterized(20)) {
    cv::circle(img, {int(p.x()), int(p.y())}, 4, {255, 255, 255}, 1);
  }

  imshow("Cubic Interpolation", img);
  waitKey(0);

  return 0;
}